

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::Resize(Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t widthIn,
                     uint32_t heightIn,Image *out,uint32_t startXOut,uint32_t startYOut,
                     uint32_t widthOut,uint32_t heightOut)

{
  ResizeForm4 p_Var1;
  uint8_t uVar2;
  bool bVar3;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar4;
  reference puVar5;
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  Image *in_R9;
  uint32_t in_stack_00000008;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000018;
  uint32_t in_stack_00000020;
  ImageManager manager;
  ResizeForm4 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  ResizeForm4 func;
  ImageTypeManager *registrator;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  uint8_t requiredType;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  ImageTypeManager *this_00;
  undefined7 in_stack_fffffffffffffef8;
  uint8_t in_stack_fffffffffffffeff;
  ImageTypeManager *in_stack_ffffffffffffff00;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  char local_70 [24];
  char *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  ResizeForm4 local_48;
  
  this = ImageTypeManager::instance();
  this_00 = this;
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar4 = ImageTypeManager::functionTable(in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
  local_48 = pFVar4->Resize;
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((local_48 == (ResizeForm4)0x0) &&
     (bVar3 = ImageTypeManager::isIntertypeConversionEnabled(this), bVar3)) {
    ImageTypeManager::imageTypes
              ((ImageTypeManager *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    in_stack_ffffffffffffffa8 = local_70;
    local_78._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if (!bVar3) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_78);
      pFVar4 = ImageTypeManager::functionTable(in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
      p_Var1 = pFVar4->Resize;
      if (p_Var1 != (ResizeForm4)0x0) {
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_78);
        uVar2 = *puVar5;
        local_48 = p_Var1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_78);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  requiredType = (uint8_t)((uint)in_stack_fffffffffffffebc >> 0x18);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              *)CONCAT17(uVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
  anon_unknown.dwarf_353bb::ImageManager::ImageManager
            ((ImageManager *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             requiredType);
  (*local_48)(in_RDI,in_ESI,in_EDX,in_ECX,in_R8D,in_R9,in_stack_00000008,in_stack_00000010,
              in_stack_00000018,in_stack_00000020);
  anon_unknown.dwarf_353bb::ImageManager::~ImageManager((ImageManager *)this_00);
  return;
}

Assistant:

void Resize( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t widthIn, uint32_t heightIn,
                 Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t widthOut, uint32_t heightOut )
    {
        initialize( in, Resize )
        func( in, startXIn, startYIn, widthIn, heightIn, out, startXOut, startYOut, widthOut, heightOut );
    }